

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O1

int pt_enc_next(pt_encoder *encoder,pt_packet *packet)

{
  pt_ip_compression pVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  pt_opcode op;
  byte bVar11;
  char cVar12;
  byte *pbVar13;
  byte local_2f [15];
  
  if (packet == (pt_packet *)0x0 || encoder == (pt_encoder *)0x0) {
    return -2;
  }
  if (0x1a < packet->type - ppt_pad) {
    return -4;
  }
  pbVar13 = encoder->pos;
  switch(packet->type) {
  case ppt_pad:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 1) {
        iVar9 = -7;
        if (pbVar13 + 1 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    *pbVar13 = 0;
    goto LAB_001092a0;
  case ppt_psb:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 0x10) {
        iVar9 = -7;
        if (pbVar13 + 0x10 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    uVar6 = 0;
    uVar8 = 0x8202820282028202;
    uVar10 = 0x8202820282028202;
    do {
      *pbVar13 = (byte)uVar10;
      pbVar13 = pbVar13 + 1;
      uVar10 = uVar10 >> 8;
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 8);
    lVar7 = 0;
    do {
      pbVar13[lVar7] = (byte)uVar8;
      uVar8 = uVar8 >> 8;
      lVar7 = lVar7 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while ((int)lVar7 != 8);
    pbVar13 = pbVar13 + lVar7;
    break;
  case ppt_psbend:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 2) {
        iVar9 = -7;
        if (pbVar13 + 2 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    pbVar13[0] = 2;
    pbVar13[1] = 0x23;
    goto LAB_001091cb;
  case ppt_fup:
    op = pt_opc_fup;
    goto LAB_00108ba6;
  case ppt_tip:
    op = pt_opc_tip;
    goto LAB_00108ba6;
  case ppt_tip_pge:
    op = pt_opc_tip_pge;
    goto LAB_00108ba6;
  case ppt_tip_pgd:
    op = pt_opc_tip_pgd;
LAB_00108ba6:
    iVar9 = pt_encode_ip(encoder,op,&(packet->payload).ip);
    return iVar9;
  case ppt_tnt_8:
    bVar3 = (packet->payload).tnt.bit_size;
    if (6 < bVar3) {
      return -5;
    }
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 1) {
        iVar9 = -7;
        if (pbVar13 + 1 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    *pbVar13 = (char)*(undefined4 *)((long)&packet->payload + 8) * '\x02' |
               (byte)(1 << ((byte)(bVar3 + 1) & 0x1f));
LAB_001092a0:
    encoder->pos = pbVar13 + 1;
    return 1;
  case ppt_tnt_64:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 8) {
        iVar9 = -7;
        if (pbVar13 + 8 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    bVar3 = (packet->payload).tnt.bit_size;
    if (0x2f < (ulong)bVar3) {
      return -2;
    }
    uVar8 = (packet->payload).tnt.payload;
    if (uVar8 >> (bVar3 & 0x3f) != 0) {
      return -2;
    }
    pbVar13[0] = 2;
    pbVar13[1] = 0xa3;
    pbVar13 = pbVar13 + 2;
    uVar8 = uVar8 | 1L << ((ulong)bVar3 & 0x3f);
    uVar6 = 2;
    do {
      *pbVar13 = (byte)uVar8;
      pbVar13 = pbVar13 + 1;
      uVar8 = uVar8 >> 8;
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 8);
    break;
  case ppt_mode:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 2) {
        iVar9 = -7;
        if (pbVar13 + 2 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    pVar1 = (packet->payload).ip.ipc;
    if (pVar1 == 0x20) {
      bVar3 = (packet->payload).cfe.vector & 3 | 0x20;
    }
    else {
      if (pVar1 != pt_ipc_suppressed) {
        return -5;
      }
      bVar3 = (packet->payload).cfe.vector & 7;
    }
    *pbVar13 = 0x99;
    goto LAB_001091c7;
  case ppt_pip:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 8) {
        iVar9 = -7;
        if (pbVar13 + 8 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    uVar6 = (packet->payload).pip.cr3 >> 4;
    uVar8 = uVar6 | 1;
    if (((packet->payload).ptw.plc & 1) == 0) {
      uVar8 = uVar6 & 0xfffffffffffffffe;
    }
    pbVar13[0] = 2;
    pbVar13[1] = 0x43;
    pbVar13 = pbVar13 + 2;
    uVar6 = 2;
    do {
      *pbVar13 = (byte)uVar8;
      pbVar13 = pbVar13 + 1;
      uVar8 = uVar8 >> 8;
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 8);
    break;
  case ppt_vmcs:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 7) {
        iVar9 = -7;
        if (pbVar13 + 7 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    pbVar13[0] = 2;
    pbVar13[1] = 200;
    pbVar13 = pbVar13 + 2;
    uVar8 = (packet->payload).pip.cr3 >> 0xc;
    uVar6 = 2;
    do {
      *pbVar13 = (byte)uVar8;
      pbVar13 = pbVar13 + 1;
      uVar8 = uVar8 >> 8;
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 7);
    break;
  case ppt_cbr:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 4) {
        iVar9 = -7;
        if (pbVar13 + 4 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    pbVar13[0] = 2;
    pbVar13[1] = 3;
    pbVar13[2] = (packet->payload).tnt.bit_size;
    pbVar13[3] = 0;
    goto LAB_00108e2e;
  case ppt_tsc:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 8) {
        iVar9 = -7;
        if (pbVar13 + 8 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    *pbVar13 = 0x19;
    pbVar13 = pbVar13 + 1;
    uVar8 = (packet->payload).pip.cr3;
    uVar6 = 1;
    do {
      *pbVar13 = (byte)uVar8;
      pbVar13 = pbVar13 + 1;
      uVar8 = uVar8 >> 8;
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 8);
    break;
  case ppt_tma:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 7) {
        iVar9 = -7;
        if (pbVar13 + 7 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    uVar8 = (ulong)(packet->payload).tma.fc;
    if (0x1ff < uVar8) {
      return -5;
    }
    uVar10 = (ulong)(packet->payload).tma.ctc;
    pbVar13[0] = 2;
    pbVar13[1] = 0x73;
    uVar6 = 3;
    do {
      uVar5 = uVar6;
      pbVar13[uVar5 - 1] = (byte)uVar10;
      uVar10 = uVar10 >> 8;
      uVar6 = uVar5 + 1;
    } while ((int)uVar6 != 5);
    pbVar13[uVar5] = 0;
    iVar9 = -2;
    do {
      pbVar13[uVar6] = (byte)uVar8;
      uVar8 = uVar8 >> 8;
      uVar6 = uVar6 + 1;
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
    pbVar13 = pbVar13 + uVar6;
    break;
  case ppt_mtc:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 2) {
        iVar9 = -7;
        if (pbVar13 + 2 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    *pbVar13 = 0x59;
    bVar3 = (packet->payload).tnt.bit_size;
LAB_001091c7:
    pbVar13[1] = bVar3;
    goto LAB_001091cb;
  case ppt_cyc:
    uVar6 = (packet->payload).pip.cr3;
    local_2f[0] = (0x1f < uVar6) << 2 | (char)uVar6 * '\b' | 3;
    uVar8 = 1;
    if (0x1f < uVar6) {
      uVar6 = uVar6 >> 5;
      uVar10 = 1;
      do {
        if (uVar10 == 0xf) {
          return -5;
        }
        uVar8 = uVar10 + 1;
        local_2f[uVar10] = 0x7f < uVar6 | (char)uVar6 * '\x02';
        bVar2 = 0x7f < uVar6;
        uVar6 = uVar6 >> 7;
        uVar10 = uVar8;
      } while (bVar2);
    }
    cVar12 = (char)uVar8;
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + (uVar8 & 0xff)) {
        iVar9 = -7;
        if (pbVar13 + (uVar8 & 0xff) <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (-1 < iVar9) {
      memcpy(pbVar13,local_2f,(long)cVar12);
      encoder->pos = pbVar13 + cVar12;
      return (int)cVar12;
    }
    return iVar9;
  case ppt_stop:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 2) {
        iVar9 = -7;
        if (pbVar13 + 2 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    pbVar13[0] = 2;
    pbVar13[1] = 0x83;
    goto LAB_001091cb;
  case ppt_ovf:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 2) {
        iVar9 = -7;
        if (pbVar13 + 2 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    pbVar13[0] = 2;
    pbVar13[1] = 0xf3;
    goto LAB_001091cb;
  case ppt_mnt:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 0xb) {
        iVar9 = -7;
        if (pbVar13 + 0xb <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    pbVar13[0] = 2;
    pbVar13[1] = 0xc3;
    pbVar13[2] = 0x88;
    pbVar13 = pbVar13 + 3;
    uVar8 = (packet->payload).pip.cr3;
    uVar6 = 3;
    do {
      *pbVar13 = (byte)uVar8;
      pbVar13 = pbVar13 + 1;
      uVar8 = uVar8 >> 8;
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 0xb);
    break;
  case ppt_exstop:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 2) {
        iVar9 = -7;
        if (pbVar13 + 2 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    bVar3 = 0xe2;
    if (((packet->payload).tnt.bit_size & 1) == 0) {
      bVar3 = 0x62;
    }
    *pbVar13 = 2;
    pbVar13[1] = bVar3;
LAB_001091cb:
    encoder->pos = pbVar13 + 2;
    return 2;
  case ppt_mwait:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 10) {
        iVar9 = -7;
        if (pbVar13 + 10 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    pbVar13[0] = 2;
    pbVar13[1] = 0xc2;
    pbVar13 = pbVar13 + 2;
    uVar8 = (ulong)(packet->payload).ip.ipc;
    uVar6 = 2;
    do {
      *pbVar13 = (byte)uVar8;
      pbVar13 = pbVar13 + 1;
      uVar8 = uVar8 >> 8;
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 6);
    uVar8 = (ulong)(packet->payload).mwait.ext;
    lVar7 = 0;
    do {
      pbVar13[lVar7] = (byte)uVar8;
      uVar8 = uVar8 >> 8;
      lVar7 = lVar7 + 1;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while ((int)lVar7 != 4);
    pbVar13 = pbVar13 + lVar7;
    break;
  case ppt_pwre:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 4) {
        iVar9 = -7;
        if (pbVar13 + 4 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    uVar8 = (ulong)((((packet->payload).pwre.sub_state & 0xf) << 8 |
                    ((packet->payload).ip.ipc & 0xf) << 0xc) +
                   (*(byte *)((long)&packet->payload + 2) & 1) * 8);
    pbVar13[0] = 2;
    pbVar13[1] = 0x22;
    pbVar13 = pbVar13 + 2;
    uVar6 = 2;
    do {
      *pbVar13 = (byte)uVar8;
      pbVar13 = pbVar13 + 1;
      uVar8 = uVar8 >> 8;
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 4);
    break;
  case ppt_pwrx:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 7) {
        iVar9 = -7;
        if (pbVar13 + 7 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    bVar3 = *(byte *)((long)&packet->payload + 2);
    uVar8 = (ulong)((bVar3 & 6) << 9 |
                   (bVar3 & 1) << 8 |
                   (packet->payload).pwre.sub_state & 0xf | ((packet->payload).ip.ipc & 0xf) << 4);
    pbVar13[0] = 2;
    pbVar13[1] = 0xa2;
    pbVar13 = pbVar13 + 2;
    uVar6 = 2;
    do {
      *pbVar13 = (byte)uVar8;
      pbVar13 = pbVar13 + 1;
      uVar8 = uVar8 >> 8;
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 7);
    break;
  case ppt_ptw:
    bVar3 = (packet->payload).ptw.plc;
    if (bVar3 - 2 < 2) {
      lVar7 = 0xfffffffb;
LAB_001091ee:
      bVar2 = true;
    }
    else {
      if (bVar3 == 0) {
        lVar7 = 4;
      }
      else {
        if (bVar3 != 1) {
          lVar7 = 0xffffffff;
          goto LAB_001091ee;
        }
        lVar7 = 8;
      }
      bVar2 = false;
    }
    if (bVar2) {
      return (int)lVar7;
    }
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + lVar7 + 2) {
        iVar9 = -7;
        if (pbVar13 + lVar7 + 2 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    bVar11 = 0x92;
    if ((undefined1  [16])((undefined1  [16])packet->payload & (undefined1  [16])0x100) ==
        (undefined1  [16])0x0) {
      bVar11 = 0x12;
    }
    *pbVar13 = 2;
    pbVar13[1] = bVar11 | bVar3 << 5;
    pbVar13 = pbVar13 + 2;
    uVar8 = (packet->payload).pip.cr3;
    uVar6 = 2;
    do {
      *pbVar13 = (byte)uVar8;
      pbVar13 = pbVar13 + 1;
      uVar8 = uVar8 >> 8;
      iVar9 = (int)uVar6;
      uVar6 = (ulong)(iVar9 + 1);
    } while (iVar9 - (int)lVar7 != 1);
    break;
  case ppt_cfe:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 4) {
        iVar9 = -7;
        if (pbVar13 + 4 <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    pbVar13[0] = 2;
    pbVar13[1] = 0x13;
    pbVar13[2] = *(char *)((long)&packet->payload + 5) << 7 | (packet->payload).tnt.bit_size & 0x1f;
    pbVar13[3] = (packet->payload).cfe.vector;
LAB_00108e2e:
    encoder->pos = pbVar13 + 4;
    return 4;
  case ppt_evd:
    if (pbVar13 == (byte *)0x0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -7;
      if ((encoder->config).begin <= pbVar13 + 0xb) {
        iVar9 = -7;
        if (pbVar13 + 0xb <= (encoder->config).end) {
          iVar9 = 0;
        }
      }
    }
    if (iVar9 < 0) {
      return iVar9;
    }
    pbVar13[0] = 2;
    pbVar13[1] = 0x53;
    pbVar13[2] = (packet->payload).tnt.bit_size & 0x1f;
    pbVar13 = pbVar13 + 3;
    uVar8 = (packet->payload).tnt.payload;
    uVar6 = 3;
    do {
      *pbVar13 = (byte)uVar8;
      pbVar13 = pbVar13 + 1;
      uVar8 = uVar8 >> 8;
      uVar4 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar4;
    } while (uVar4 != 0xb);
  }
  encoder->pos = pbVar13;
  return (int)uVar6;
}

Assistant:

int pt_enc_next(struct pt_encoder *encoder, const struct pt_packet *packet)
{
	uint8_t *pos, *begin;
	int errcode;

	if (!encoder || !packet)
		return -pte_invalid;

	pos = begin = encoder->pos;
	switch (packet->type) {
	case ppt_pad:
		errcode = pt_reserve(encoder, ptps_pad);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_pad;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_psb: {
		uint64_t psb;

		errcode = pt_reserve(encoder, ptps_psb);
		if (errcode < 0)
			return errcode;

		psb = ((uint64_t) pt_psb_hilo << 48 |
		       (uint64_t) pt_psb_hilo << 32 |
		       (uint64_t) pt_psb_hilo << 16 |
		       (uint64_t) pt_psb_hilo);

		pos = pt_encode_int(pos, psb, 8);
		pos = pt_encode_int(pos, psb, 8);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_psbend:
		errcode = pt_reserve(encoder, ptps_psbend);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_psbend;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_ovf:
		errcode = pt_reserve(encoder, ptps_ovf);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_ovf;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_fup:
		return pt_encode_ip(encoder, pt_opc_fup, &packet->payload.ip);

	case ppt_tip:
		return pt_encode_ip(encoder, pt_opc_tip, &packet->payload.ip);

	case ppt_tip_pge:
		return pt_encode_ip(encoder, pt_opc_tip_pge,
				    &packet->payload.ip);

	case ppt_tip_pgd:
		return pt_encode_ip(encoder, pt_opc_tip_pgd,
				    &packet->payload.ip);

	case ppt_tnt_8: {
		uint8_t opc, stop;

		if (packet->payload.tnt.bit_size >= 7)
			return -pte_bad_packet;

		errcode = pt_reserve(encoder, ptps_tnt_8);
		if (errcode < 0)
			return errcode;

		stop = packet->payload.tnt.bit_size + pt_opm_tnt_8_shr;
		opc = (uint8_t)
			(packet->payload.tnt.payload << pt_opm_tnt_8_shr);

		*pos++ = (uint8_t) (opc | (1u << stop));

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_tnt_64: {
		uint64_t tnt, stop;

		errcode = pt_reserve(encoder, ptps_tnt_64);
		if (errcode < 0)
			return errcode;

		if (packet->payload.tnt.bit_size >= pt_pl_tnt_64_bits)
			return -pte_invalid;

		stop = 1ull << packet->payload.tnt.bit_size;
		tnt = packet->payload.tnt.payload;

		if (tnt & ~(stop - 1))
			return -pte_invalid;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_tnt_64;
		pos = pt_encode_int(pos, tnt | stop, pt_pl_tnt_64_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mode: {
		uint8_t mode;

		errcode = pt_reserve(encoder, ptps_mode);
		if (errcode < 0)
			return errcode;

		switch (packet->payload.mode.leaf) {
		default:
			return -pte_bad_packet;

		case pt_mol_exec:
			mode = pt_mol_exec;

			if (packet->payload.mode.bits.exec.csl)
				mode |= pt_mob_exec_csl;

			if (packet->payload.mode.bits.exec.csd)
				mode |= pt_mob_exec_csd;

			if (packet->payload.mode.bits.exec.iflag)
				mode |= pt_mob_exec_iflag;
			break;

		case pt_mol_tsx:
			mode = pt_mol_tsx;

			if (packet->payload.mode.bits.tsx.intx)
				mode |= pt_mob_tsx_intx;

			if (packet->payload.mode.bits.tsx.abrt)
				mode |= pt_mob_tsx_abrt;
			break;
		}

		*pos++ = pt_opc_mode;
		*pos++ = mode;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_pip: {
		uint64_t cr3;

		errcode = pt_reserve(encoder, ptps_pip);
		if (errcode < 0)
			return errcode;

		cr3 = packet->payload.pip.cr3;
		cr3 >>= pt_pl_pip_shl;
		cr3 <<= pt_pl_pip_shr;

		if (packet->payload.pip.nr)
			cr3 |= (uint64_t) pt_pl_pip_nr;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pip;
		pos = pt_encode_int(pos, cr3, pt_pl_pip_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_tsc:
		errcode = pt_reserve(encoder, ptps_tsc);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_tsc;
		pos = pt_encode_int(pos, packet->payload.tsc.tsc,
				    pt_pl_tsc_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_cbr:
		errcode = pt_reserve(encoder, ptps_cbr);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_cbr;
		*pos++ = packet->payload.cbr.ratio;
		*pos++ = 0;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_tma: {
		uint16_t ctc, fc;

		errcode = pt_reserve(encoder, ptps_tma);
		if (errcode < 0)
			return errcode;

		ctc = packet->payload.tma.ctc;
		fc = packet->payload.tma.fc;

		if (fc & ~pt_pl_tma_fc_mask)
			return -pte_bad_packet;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_tma;
		pos = pt_encode_int(pos, ctc, pt_pl_tma_ctc_size);
		*pos++ = 0;
		pos = pt_encode_int(pos, fc, pt_pl_tma_fc_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mtc:
		errcode = pt_reserve(encoder, ptps_mtc);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_mtc;
		*pos++ = packet->payload.mtc.ctc;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_cyc: {
		uint8_t byte[pt_pl_cyc_max_size], index, end;
		uint64_t ctc;

		ctc = (uint8_t) packet->payload.cyc.value;
		ctc <<= pt_opm_cyc_shr;

		byte[0] = pt_opc_cyc;
		byte[0] |= (uint8_t) ctc;

		ctc = packet->payload.cyc.value;
		ctc >>= (8 - pt_opm_cyc_shr);
		if (ctc)
			byte[0] |= pt_opm_cyc_ext;

		for (end = 1; ctc; ++end) {
			/* Check if the CYC payload is too big. */
			if (pt_pl_cyc_max_size <= end)
				return -pte_bad_packet;

			ctc <<= pt_opm_cycx_shr;

			byte[end] = (uint8_t) ctc;

			ctc >>= 8;
			if (ctc)
				byte[end] |= pt_opm_cycx_ext;
		}

		errcode = pt_reserve(encoder, end);
		if (errcode < 0)
			return errcode;

		for (index = 0; index < end; ++index)
			*pos++ = byte[index];

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_stop:
		errcode = pt_reserve(encoder, ptps_stop);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_stop;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_vmcs:
		errcode = pt_reserve(encoder, ptps_vmcs);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_vmcs;
		pos = pt_encode_int(pos,
				    packet->payload.vmcs.base >> pt_pl_vmcs_shl,
				    pt_pl_vmcs_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_mnt:
		errcode = pt_reserve(encoder, ptps_mnt);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_ext2;
		*pos++ = pt_ext2_mnt;
		pos = pt_encode_int(pos, packet->payload.mnt.payload,
				    pt_pl_mnt_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_exstop: {
		uint8_t ext;

		errcode = pt_reserve(encoder, ptps_exstop);
		if (errcode < 0)
			return errcode;

		ext = packet->payload.exstop.ip ?
			pt_ext_exstop_ip : pt_ext_exstop;

		*pos++ = pt_opc_ext;
		*pos++ = ext;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mwait:
		errcode = pt_reserve(encoder, ptps_mwait);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_mwait;
		pos = pt_encode_int(pos, packet->payload.mwait.hints,
				    pt_pl_mwait_hints_size);
		pos = pt_encode_int(pos, packet->payload.mwait.ext,
				    pt_pl_mwait_ext_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_pwre: {
		uint64_t payload;

		errcode = pt_reserve(encoder, ptps_pwre);
		if (errcode < 0)
			return errcode;

		payload = 0ull;
		payload |= ((uint64_t) packet->payload.pwre.state <<
			    pt_pl_pwre_state_shr) &
			(uint64_t) pt_pl_pwre_state_mask;
		payload |= ((uint64_t) packet->payload.pwre.sub_state <<
			    pt_pl_pwre_sub_state_shr) &
			(uint64_t) pt_pl_pwre_sub_state_mask;

		if (packet->payload.pwre.hw)
			payload |= (uint64_t) pt_pl_pwre_hw_mask;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pwre;
		pos = pt_encode_int(pos, payload, pt_pl_pwre_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_pwrx: {
		uint64_t payload;

		errcode = pt_reserve(encoder, ptps_pwrx);
		if (errcode < 0)
			return errcode;

		payload = 0ull;
		payload |= ((uint64_t) packet->payload.pwrx.last <<
			    pt_pl_pwrx_last_shr) &
			(uint64_t) pt_pl_pwrx_last_mask;
		payload |= ((uint64_t) packet->payload.pwrx.deepest <<
			    pt_pl_pwrx_deepest_shr) &
			(uint64_t) pt_pl_pwrx_deepest_mask;

		if (packet->payload.pwrx.interrupt)
			payload |= (uint64_t) pt_pl_pwrx_wr_int;
		if (packet->payload.pwrx.store)
			payload |= (uint64_t) pt_pl_pwrx_wr_store;
		if (packet->payload.pwrx.autonomous)
			payload |= (uint64_t) pt_pl_pwrx_wr_hw;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pwrx;
		pos = pt_encode_int(pos, payload, pt_pl_pwrx_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_ptw: {
		uint8_t plc, ext;
		int size;

		plc = packet->payload.ptw.plc;

		size = pt_ptw_size(plc);
		if (size < 0)
			return size;

		errcode = pt_reserve(encoder,
				     (unsigned int) (pt_opcs_ptw + size));
		if (errcode < 0)
			return errcode;

		ext = pt_ext_ptw;
		ext |= plc << pt_opm_ptw_pb_shr;

		if (packet->payload.ptw.ip)
			ext |= (uint8_t) pt_opm_ptw_ip;

		*pos++ = pt_opc_ext;
		*pos++ = ext;
		pos = pt_encode_int(pos, packet->payload.ptw.payload, size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_cfe: {
		uint8_t type;

		errcode = pt_reserve(encoder, ptps_cfe);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_cfe;

		type = packet->payload.cfe.type & pt_pl_cfe_type;
		if (packet->payload.cfe.ip)
			type |= pt_pl_cfe_ip;

		*pos++ = type;
		*pos++ = packet->payload.cfe.vector;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_evd:
		errcode = pt_reserve(encoder, ptps_evd);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_evd;

		*pos++ = packet->payload.evd.type & pt_pl_evd_type;
		pos = pt_encode_int(pos, packet->payload.evd.payload,
				    pt_pl_evd_pl_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_unknown:
	case ppt_invalid:
		return -pte_bad_opc;
	}

	return -pte_bad_opc;
}